

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O2

TextFile * __thiscall asl::TextFile::operator>>(TextFile *this,String *x)

{
  int iVar1;
  int in_EDX;
  FILE *pFVar2;
  char s [256];
  char acStack_118 [256];
  
  pFVar2 = (this->super_File)._file;
  if (pFVar2 == (FILE *)0x0) {
    iVar1 = open(this,(char *)0x0,in_EDX);
    if ((char)iVar1 == '\0') {
      return this;
    }
    pFVar2 = (this->super_File)._file;
  }
  __isoc99_fscanf(pFVar2,"%255s",acStack_118);
  String::operator=(x,acStack_118);
  return this;
}

Assistant:

TextFile& TextFile::operator>>(String &x)
{
	if(!_file && !open(READ))
		return *this;
	char s[256];
	int n = fscanf(_file, "%255s", s); if (n < 1) {}
	x = &s[0];
	return *this;
}